

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O1

void on_message_processing_completed_callback
               (MQ_MESSAGE_HANDLE message,MESSAGE_QUEUE_RESULT result,USER_DEFINED_REASON reason,
               void *message_context)

{
  long *plVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  undefined8 uVar2;
  undefined8 uVar3;
  
  if (message_context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                 ,"on_message_processing_completed_callback",0x38f,1,
                 "on_message_processing_completed_callback invoked with NULL context");
      return;
    }
    return;
  }
  if (result == MESSAGE_QUEUE_CANCELLED) {
    if (*(int *)(*(long *)((long)message_context + 0x10) + 0x28) == 3) {
      *(undefined8 *)(*(long *)((long)message_context + 0x10) + 0x68) = 0;
      uVar2 = 4;
      uVar3 = 2;
      goto LAB_0013cac7;
    }
LAB_0013cab5:
    plVar1 = (long *)(*(long *)((long)message_context + 0x10) + 0x68);
    *plVar1 = *plVar1 + 1;
    uVar2 = 2;
  }
  else {
    if (result != MESSAGE_QUEUE_TIMEOUT) {
      if (result == MESSAGE_QUEUE_SUCCESS) {
        *(undefined8 *)(*(long *)((long)message_context + 0x10) + 0x68) = 0;
        uVar3 = 0;
        uVar2 = 0;
        goto LAB_0013cac7;
      }
      goto LAB_0013cab5;
    }
    plVar1 = (long *)(*(long *)((long)message_context + 0x10) + 0x68);
    *plVar1 = *plVar1 + 1;
    uVar2 = 3;
  }
  uVar3 = 1;
LAB_0013cac7:
  if (*(code **)((long)message_context + 0x18) != (code *)0x0) {
    (**(code **)((long)message_context + 0x18))
              (uVar3,uVar2,*(undefined8 *)((long)message_context + 0x20));
  }
  message_destroy((MESSAGE_HANDLE)message);
  destroy_message_send_context((MESSAGE_SEND_CONTEXT *)message_context);
  return;
}

Assistant:

static void on_message_processing_completed_callback(MQ_MESSAGE_HANDLE message, MESSAGE_QUEUE_RESULT result, USER_DEFINED_REASON reason, void* message_context)
{
    (void)reason;

    if (message_context == NULL)
    {
        LogError("on_message_processing_completed_callback invoked with NULL context");
    }
    else
    {
        MESSAGE_SEND_CONTEXT* msg_ctx = (MESSAGE_SEND_CONTEXT*)message_context;
        AMQP_MESSENGER_SEND_RESULT messenger_send_result;
        AMQP_MESSENGER_REASON messenger_send_reason;

        if (result == MESSAGE_QUEUE_SUCCESS)
        {
            messenger_send_result = AMQP_MESSENGER_SEND_RESULT_SUCCESS;
            messenger_send_reason = AMQP_MESSENGER_REASON_NONE;

            msg_ctx->messenger->send_error_count = 0;
        }
        else if (result == MESSAGE_QUEUE_TIMEOUT)
        {
            messenger_send_result = AMQP_MESSENGER_SEND_RESULT_ERROR;
            messenger_send_reason = AMQP_MESSENGER_REASON_TIMEOUT;

            msg_ctx->messenger->send_error_count++;
        }
        else if (result == MESSAGE_QUEUE_CANCELLED && msg_ctx->messenger->state == AMQP_MESSENGER_STATE_STOPPED)
        {
            messenger_send_result = AMQP_MESSENGER_SEND_RESULT_CANCELLED;
            messenger_send_reason = AMQP_MESSENGER_REASON_MESSENGER_DESTROYED;

            msg_ctx->messenger->send_error_count = 0;
        }
        else
        {
            messenger_send_result = AMQP_MESSENGER_SEND_RESULT_ERROR;
            messenger_send_reason = AMQP_MESSENGER_REASON_FAIL_SENDING;

            msg_ctx->messenger->send_error_count++;
        }

        if (msg_ctx->on_send_complete_callback != NULL)
        {
            msg_ctx->on_send_complete_callback(messenger_send_result, messenger_send_reason, msg_ctx->user_context);
        }

        message_destroy((MESSAGE_HANDLE)message);
        destroy_message_send_context(msg_ctx);
    }
}